

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_iceguy.cpp
# Opt level: O1

int AF_A_IceGuyDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  undefined4 in_register_00000014;
  FString *this;
  VMValue *pVVar7;
  char *__assertion;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  VMValue params [3];
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  undefined8 *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bc1a1;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    pVVar7 = param;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar10 = (**(code **)*puVar2)(puVar2);
        uVar5 = auVar10._8_8_;
        puVar2[1] = auVar10._0_8_;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar9 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar9);
      pVVar7 = (VMValue *)(ulong)(pPVar6 == pPVar4 || bVar9);
      if (pPVar6 != pPVar4 && !bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar4) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bc1a1;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005bc176;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3,pVVar7,uVar5,ret);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005bc1a1;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      puVar2[0x15] = 0;
      puVar2[0x16] = 0;
      puVar2[0x17] = 0;
      if (puVar2[1] == 0) {
        uVar5 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = uVar5;
      }
      puVar2[0x2c] = *(undefined8 *)(*(long *)(puVar2[1] + 200) + 0x160);
      local_68.field_1.atag = 1;
      local_68.field_3.Type = '\x03';
      local_50 = 1;
      local_4c = 3;
      local_48.Chars = (char *)0x0;
      local_40 = 8;
      local_3c[0] = 3;
      local_68.field_1.a = puVar2;
      local_58 = puVar2;
      VMFrameStack::Call(stack,&A_FreezeDeathChunks_VMPtr->super_VMFunction,
                         (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
      lVar8 = -0x30;
      this = &local_48;
      do {
        if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
          FString::~FString(this);
        }
        this = this + -2;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005bc176:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005bc1a1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                ,0x65,"int AF_A_IceGuyDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceGuyDie)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;
	CALL_ACTION(A_FreezeDeathChunks, self);
	return 0;
}